

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::SetViewports
          (DeviceContextVkImpl *this,Uint32 NumViewports,Viewport *pViewports,Uint32 RTWidth,
          Uint32 RTHeight)

{
  bool bVar1;
  Char *pCVar2;
  PipelineStateVkImpl *this_00;
  PipelineStateDesc *this_01;
  Uint32 UVar3;
  Uint32 UVar4;
  Uint32 VPHeight;
  Uint32 VPWidth;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 RTHeight_local;
  Uint32 RTWidth_local;
  Viewport *pViewports_local;
  Uint32 NumViewports_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_4_ = RTHeight;
  msg.field_2._12_4_ = RTWidth;
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetViewports
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,NumViewports,pViewports,
             (Uint32 *)(msg.field_2._M_local_buf + 0xc),(Uint32 *)(msg.field_2._M_local_buf + 8));
  if (NumViewports !=
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports) {
    FormatString<char[31]>((string *)local_48,(char (*) [31])"Unexpected number of viewports");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x6b8);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (((this->m_State).NullRenderTargets & 1U) != 0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumViewports != 1) {
      FormatString<char[74]>
                ((string *)&VPHeight,
                 (char (*) [74])
                 "Only a single viewport is supported when rendering without render targets");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x6bc);
      std::__cxx11::string::~string((string *)&VPHeight);
    }
    UVar3 = (Uint32)(long)(float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>
                                 ).super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                 [0].Width;
    UVar4 = (Uint32)(long)(float)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>
                                 ).super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Viewports
                                 [0].Height;
    if (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth != UVar3) ||
       ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight != UVar4)) {
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
      std::
      unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      ::reset(&this->m_DynamicRenderingInfo,(pointer)0x0);
    }
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth = UVar3;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight = UVar4;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices = 1;
    (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples = 1;
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  if (bVar1) {
    this_00 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    this_01 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                        (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline(this_01);
    if (bVar1) {
      CommitViewports(this);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetViewports(Uint32 NumViewports, const Viewport* pViewports, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetViewports(NumViewports, pViewports, RTWidth, RTHeight);
    VERIFY(NumViewports == m_NumViewports, "Unexpected number of viewports");

    if (m_State.NullRenderTargets)
    {
        DEV_CHECK_ERR(m_NumViewports == 1, "Only a single viewport is supported when rendering without render targets");

        const Uint32 VPWidth  = static_cast<Uint32>(m_Viewports[0].Width);
        const Uint32 VPHeight = static_cast<Uint32>(m_Viewports[0].Height);
        if (m_FramebufferWidth != VPWidth || m_FramebufferHeight != VPHeight)
        {
            // We need to bind another framebuffer since the size has changed
            m_vkFramebuffer = VK_NULL_HANDLE;
            m_DynamicRenderingInfo.reset();
        }
        m_FramebufferWidth   = VPWidth;
        m_FramebufferHeight  = VPHeight;
        m_FramebufferSlices  = 1;
        m_FramebufferSamples = 1;
    }

    // If no graphics PSO is currently bound, viewports will be committed by
    // the SetPipelineState() when a graphics PSO is set.
    if (m_pPipelineState && m_pPipelineState->GetDesc().IsAnyGraphicsPipeline())
    {
        CommitViewports();
    }
}